

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subqueryref.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::SubqueryRef::Copy(SubqueryRef *this)

{
  pointer pcVar1;
  __uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_> _Var2;
  pointer pSVar3;
  SubqueryRef *this_00;
  pointer pSVar4;
  type target;
  pointer *__ptr;
  TableRef *in_RSI;
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_58;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_50;
  __uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_> local_48;
  string local_40;
  
  pSVar3 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)(in_RSI + 1));
  (*(pSVar3->super_SQLStatement)._vptr_SQLStatement[3])(&local_48,pSVar3);
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>)
       (_Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>)
       0x0;
  this_00 = (SubqueryRef *)operator_new(0x70);
  local_50._M_head_impl =
       (SelectStatement *)
       _Var2._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  pcVar1 = (in_RSI->alias)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (in_RSI->alias)._M_string_length);
  SubqueryRef(this_00,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                       *)&local_50,&local_40);
  local_58._M_head_impl = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (SelectStatement *)0x0) {
    (*((local_50._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  if (local_48._M_t.
      super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
      .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>)
      0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
                          .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl + 8)
    )();
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl =
       (tuple<duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>)
       (_Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>)
       0x0;
  pSVar4 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
           operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                       *)&local_58);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pSVar4->super_TableRef).column_name_alias,
              &(in_RSI->column_name_alias).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  target = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
           operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                      *)&local_58);
  TableRef::CopyProperties(in_RSI,&target->super_TableRef);
  (this->super_TableRef)._vptr_TableRef = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> SubqueryRef::Copy() {
	auto copy = make_uniq<SubqueryRef>(unique_ptr_cast<SQLStatement, SelectStatement>(subquery->Copy()), alias);
	copy->column_name_alias = column_name_alias;
	CopyProperties(*copy);
	return std::move(copy);
}